

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

VkResult vmaCreateAliasingImage
                   (VmaAllocator allocator,VmaAllocation allocation,
                   VkImageCreateInfo *pImageCreateInfo,VkImage *pImage)

{
  VkResult VVar1;
  VkResult VVar2;
  VkAllocationCallbacks *pVVar3;
  
  *pImage = (VkImage)0x0;
  VVar1 = VK_ERROR_INITIALIZATION_FAILED;
  if (((((pImageCreateInfo->extent).width != 0) && ((pImageCreateInfo->extent).height != 0)) &&
      ((pImageCreateInfo->extent).depth != 0)) &&
     ((pImageCreateInfo->mipLevels != 0 && (pImageCreateInfo->arrayLayers != 0)))) {
    pVVar3 = (VkAllocationCallbacks *)0x0;
    if (allocator->m_AllocationCallbacksSpecified != false) {
      pVVar3 = &allocator->m_AllocationCallbacks;
    }
    VVar1 = (*(allocator->m_VulkanFunctions).vkCreateImage)
                      (allocator->m_hDevice,pImageCreateInfo,pVVar3,pImage);
    if ((VK_ERROR_OUT_OF_HOST_MEMORY < VVar1) &&
       (VVar2 = VmaAllocator_T::BindImageMemory(allocator,allocation,0,*pImage,(void *)0x0),
       VVar1 = VK_SUCCESS, VVar2 < VK_SUCCESS)) {
      pVVar3 = (VkAllocationCallbacks *)0x0;
      if (allocator->m_AllocationCallbacksSpecified != false) {
        pVVar3 = &allocator->m_AllocationCallbacks;
      }
      (*(allocator->m_VulkanFunctions).vkDestroyImage)(allocator->m_hDevice,*pImage,pVVar3);
      VVar1 = VVar2;
    }
  }
  return VVar1;
}

Assistant:

VMA_CALL_PRE VkResult VMA_CALL_POST vmaCreateAliasingImage(
    VmaAllocator VMA_NOT_NULL allocator,
    VmaAllocation VMA_NOT_NULL allocation,
    const VkImageCreateInfo* VMA_NOT_NULL pImageCreateInfo,
    VkImage VMA_NULLABLE_NON_DISPATCHABLE* VMA_NOT_NULL pImage)
{
    VMA_ASSERT(allocator && pImageCreateInfo && pImage && allocation);

    *pImage = VK_NULL_HANDLE;

    VMA_DEBUG_LOG("vmaCreateImage");

    if (pImageCreateInfo->extent.width == 0 ||
        pImageCreateInfo->extent.height == 0 ||
        pImageCreateInfo->extent.depth == 0 ||
        pImageCreateInfo->mipLevels == 0 ||
        pImageCreateInfo->arrayLayers == 0)
    {
        return VK_ERROR_INITIALIZATION_FAILED;
    }

    VMA_DEBUG_GLOBAL_MUTEX_LOCK

    // 1. Create VkImage.
    VkResult res = (*allocator->GetVulkanFunctions().vkCreateImage)(
        allocator->m_hDevice,
        pImageCreateInfo,
        allocator->GetAllocationCallbacks(),
        pImage);
    if (res >= 0)
    {
        // 2. Bind image with memory.
        res = allocator->BindImageMemory(allocation, 0, *pImage, VMA_NULL);
        if (res >= 0)
        {
            return VK_SUCCESS;
        }
        (*allocator->GetVulkanFunctions().vkDestroyImage)(allocator->m_hDevice, *pImage, allocator->GetAllocationCallbacks());
    }
    return res;
}